

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

void __thiscall aeron::archive::Context::Context(Context *this,Configuration *cfg)

{
  Configuration::Configuration(&this->cfg_,cfg);
  (this->aeronDirectoryName_)._M_dataplus._M_p = (pointer)&(this->aeronDirectoryName_).field_2;
  (this->aeronDirectoryName_)._M_string_length = 0;
  (this->aeronDirectoryName_).field_2._M_local_buf[0] = '\0';
  (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeronContext_).super___shared_ptr<aeron::Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->controlRequestChannel_)._M_dataplus._M_p = (pointer)&(this->controlRequestChannel_).field_2
  ;
  (this->controlRequestChannel_)._M_string_length = 0;
  (this->controlRequestChannel_).field_2._M_local_buf[0] = '\0';
  controlRequestChannel(this,&(this->cfg_).controlChannel);
  return;
}

Assistant:

Context::Context(const Configuration& cfg)
    : cfg_(cfg) {
    controlRequestChannel(cfg_.controlChannel);
}